

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Decoration __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::TranslateNonUniformDecoration
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  bool bVar1;
  CoherentFlags *coherentFlags_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar1 = spv::Builder::AccessChain::CoherentFlags::isNonUniform(coherentFlags);
  if (bVar1) {
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_EXT_descriptor_indexing",Spv_1_5);
    spv::Builder::addCapability(&this->builder,CapabilityShaderNonUniform);
    this_local._4_4_ = DecorationNonUniform;
  }
  else {
    this_local._4_4_ = DecorationMax;
  }
  return this_local._4_4_;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateNonUniformDecoration(
    const spv::Builder::AccessChain::CoherentFlags& coherentFlags)
{
    if (coherentFlags.isNonUniform()) {
        builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
        builder.addCapability(spv::CapabilityShaderNonUniformEXT);
        return spv::DecorationNonUniformEXT;
    } else
        return spv::DecorationMax;
}